

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::IntegerFunctionCase::~IntegerFunctionCase(IntegerFunctionCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IntegerFunctionCase_00c0da08;
  ShaderSpec::~ShaderSpec(&this->m_spec);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

IntegerFunctionCase::~IntegerFunctionCase (void)
{
}